

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

void __thiscall crnlib::qdxt5::optimize_selectors_task(qdxt5 *this,uint64 data,void *pData_ptr)

{
  byte bVar1;
  dxt_pixel_block *pdVar2;
  dxt5_block *pdVar3;
  bool bVar4;
  int iVar5;
  crn_thread_id_t cVar6;
  byte bVar7;
  uint uVar8;
  undefined8 uVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  uint y;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  vector<unsigned_int> *block_indices;
  vector<unsigned_int> *pvVar16;
  ulong uVar17;
  dxt5_block blk;
  vector<unsigned_int> block_categories [2];
  uint values [8];
  undefined8 local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  uint local_b0;
  int local_ac;
  vector<unsigned_int> local_a8;
  vector<unsigned_int> local_98;
  ulong local_80;
  uint64 local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  uint local_58 [10];
  
  local_98.m_p = (uint *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_a8.m_p = (uint *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_c8 = (long *)pData_ptr;
  local_78 = data;
  vector<unsigned_int>::reserve(&local_a8,0x800);
  vector<unsigned_int>::reserve(&local_98,0x800);
  if (*(int *)(*local_c8 + 8) != 0) {
    uVar13 = 0;
    do {
      if ((this->m_canceled != false) ||
         ((((char)uVar13 == '\0' &&
           (cVar6 = crn_get_current_thread_id(), cVar6 == this->m_main_thread_id)) &&
          (bVar4 = update_progress(this,(uint)uVar13,*(int *)(*local_c8 + 8) - 1), !bVar4)))) break;
      uVar10 = this->m_pTask_pool->m_num_threads;
      uVar14 = (ulong)uVar10;
      if (uVar10 == 0) {
LAB_001424ef:
        if (1 < *(uint *)(*(long *)*local_c8 + 8 + uVar13 * 0x10)) {
          local_80 = uVar13;
          if (local_a8.m_size != 0) {
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
          }
          if (local_98.m_size != 0) {
            local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
          }
          plVar11 = (long *)(*(long *)*local_c8 + uVar13 * 0x10);
          if ((int)plVar11[1] != 0) {
            uVar13 = 0;
            do {
              uVar10 = *(uint *)(*plVar11 + uVar13 * 4);
              uVar8 = this->m_elements_per_block * uVar10;
              bVar4 = this->m_pDst_elements[uVar8].m_endpoints[0] <=
                      this->m_pDst_elements[uVar8].m_endpoints[1];
              uVar8 = (&local_a8)[bVar4].m_size;
              if ((&local_a8)[bVar4].m_capacity <= uVar8) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)(&local_a8 + bVar4),uVar8 + 1,true,4,
                           (object_mover)0x0,false);
                uVar8 = (&local_a8)[bVar4].m_size;
              }
              uVar14 = (ulong)uVar8;
              (&local_a8)[bVar4].m_p[uVar14] = uVar10;
              (&local_a8)[bVar4].m_size = (&local_a8)[bVar4].m_size + 1;
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(uint *)(plVar11 + 1));
          }
          local_d0 = 0;
          uVar9 = CONCAT71((int7)(uVar14 >> 8),1);
          pvVar16 = &local_a8;
          do {
            local_b0 = (uint)uVar9;
            uVar10 = pvVar16->m_size;
            uVar13 = (ulong)uVar10;
            if (1 < uVar10) {
              lVar12 = 0;
              do {
                local_70 = lVar12 * 4;
                local_c0 = 0;
                do {
                  local_b8 = 0;
                  uVar14 = 0xffffffffff;
                  iVar5 = 0;
                  do {
                    if (uVar10 == 0) {
                      uVar10 = 0;
                      uVar15 = 0;
                    }
                    else {
                      local_68 = uVar14;
                      local_ac = iVar5;
                      uVar17 = 0;
                      uVar15 = 0;
                      do {
                        local_60 = uVar15;
                        uVar10 = pvVar16->m_p[uVar17];
                        pdVar2 = this->m_pBlocks;
                        uVar8 = this->m_elements_per_block * uVar10;
                        dxt5_block::get_block_values
                                  (local_58,(uint)this->m_pDst_elements[uVar8].m_endpoints[0],
                                   (uint)this->m_pDst_elements[uVar8].m_endpoints[1]);
                        iVar5 = (uint)pdVar2[uVar10].m_pixels[lVar12][local_c0].field_0.c
                                      [(this->m_params).m_comp_index] - local_58[local_b8];
                        uVar15 = local_60 + (uint)(iVar5 * iVar5);
                        uVar17 = uVar17 + 1;
                        uVar10 = pvVar16->m_size;
                        uVar13 = (ulong)uVar10;
                        uVar14 = local_68;
                        iVar5 = local_ac;
                      } while (uVar17 < uVar13);
                    }
                    if (uVar15 < uVar14) {
                      uVar14 = uVar15;
                      iVar5 = (int)local_b8;
                    }
                    local_b8 = local_b8 + 1;
                  } while (local_b8 != 8);
                  uVar8 = (int)(local_c0 + local_70) * 3;
                  uVar14 = (ulong)(uVar8 >> 3);
                  bVar7 = (byte)uVar8 & 7;
                  bVar1 = *(byte *)((long)&local_d0 + uVar14 + 2);
                  if ((ulong)(local_c0 + local_70) < 0xe) {
                    uVar8 = iVar5 << bVar7 |
                            ~(7 << bVar7) &
                            (uint)CONCAT11(*(undefined1 *)((long)&local_d0 + uVar14 + 3),bVar1);
                    *(char *)((long)&local_d0 + uVar14 + 3) = (char)(uVar8 >> 8);
                  }
                  else {
                    uVar8 = iVar5 << bVar7 | (uint)bVar1 & ~(7 << bVar7);
                  }
                  *(char *)((long)&local_d0 + uVar14 + 2) = (char)uVar8;
                  local_c0 = local_c0 + 1;
                } while (local_c0 != 4);
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              if ((int)uVar13 != 0) {
                uVar13 = 0;
                do {
                  uVar10 = this->m_elements_per_block * pvVar16->m_p[uVar13];
                  pdVar3 = this->m_pDst_elements;
                  *(undefined2 *)(pdVar3[uVar10].m_selectors + 4) = local_d0._6_2_;
                  *(undefined4 *)pdVar3[uVar10].m_selectors = local_d0._2_4_;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < pvVar16->m_size);
              }
            }
            pvVar16 = &local_98;
            uVar9 = 0;
            uVar13 = local_80;
          } while ((local_b0 & 1) != 0);
        }
      }
      else {
        uVar14 = (ulong)(uVar10 + 1);
        if ((int)((uVar13 & 0xffffffff) % uVar14) == (int)local_78) goto LAB_001424ef;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < *(uint *)(*local_c8 + 8));
  }
  lVar12 = 0x20;
  do {
    if (*(void **)((long)&local_b8 + lVar12) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_b8 + lVar12));
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  return;
}

Assistant:

void qdxt5::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt5_block& src_block = get_block(block_index);

                block_categories[src_block.is_alpha6_block()].push_back(block_index);
            }

            dxt5_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        for (uint s = 0; s < dxt5_block::cMaxSelectorValues; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt5_block& dst_block = get_block(block_index);

                                uint values[dxt5_block::cMaxSelectorValues];
                                dxt5_block::get_block_values(values, dst_block.get_low_alpha(), dst_block.get_high_alpha());

                                int error = math::square((int)orig_color[m_params.m_comp_index] - (int)values[s]);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt5_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }